

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O0

void Dau_DsdMergeSubstitute_rec
               (Dau_Sto_t *pS,char *pStr,char **p,int *pMatches,int *pStatus,int fWrite)

{
  char *pBeg_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int New_1;
  char *q_1;
  char *pBeg;
  int Status;
  int StatusFan;
  int New;
  char *pTemp;
  char *q;
  int fWrite_local;
  int *pStatus_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  Dau_Sto_t *pS_local;
  
  if (**p == '!') {
    if (fWrite != 0) {
      Dau_DsdMergeStoreAddToOutputChar(pS,**p);
    }
    *p = *p + 1;
  }
  while( true ) {
    if (((**p < 'A') || (bVar1 = true, 'F' < **p)) && (bVar1 = false, '/' < **p)) {
      bVar1 = **p < ':';
    }
    if (!bVar1) break;
    if (fWrite != 0) {
      Dau_DsdMergeStoreAddToOutputChar(pS,**p);
    }
    *p = *p + 1;
  }
  if ((**p == '<') && (iVar3 = pMatches[(long)*p - (long)pStr], pStr[(long)iVar3 + 1] == '{')) {
    _StatusFan = *p;
    *p = pStr + (long)iVar3 + 1;
    if (fWrite != 0) {
      for (; _StatusFan < pStr + (long)iVar3 + 1; _StatusFan = _StatusFan + 1) {
        Dau_DsdMergeStoreAddToOutputChar(pS,*_StatusFan);
      }
    }
  }
  if ((**p < 'a') || ('z' < **p)) {
    if ((**p != '(') && (((**p != '[' && (**p != '<')) && (**p != '{')))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x1ec,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
    iVar3 = pStatus[(long)*p - (long)pStr];
    pcVar5 = pStr + pMatches[(long)*p - (long)pStr];
    if ((int)*pcVar5 != **p + 1 + (uint)(**p != '(')) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x19f,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
    if (fWrite == 0) {
      if (iVar3 != 3) {
        __assert_fail("Status == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1a2,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
      *p = pcVar5;
    }
    else {
      if (iVar3 == 3) {
        __assert_fail("Status != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1a6,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
      if (iVar3 == 0) {
        Dau_DsdMergeStoreAddToOutputChar(pS,**p);
        *p = *p + 1;
        while (*p < pcVar5) {
          if (**p == '!') {
            Dau_DsdMergeStoreAddToOutputChar(pS,'!');
            *p = *p + 1;
          }
          Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,1);
          *p = *p + 1;
        }
        Dau_DsdMergeStoreAddToOutputChar(pS,**p);
        if (*p != pcVar5) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x1b4,
                        "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                       );
        }
      }
      else if (((iVar3 == 1) || (**p == '<')) || (**p == '{')) {
        Dau_DsdMergeStoreAddToOutputChar(pS,**p);
        *p = *p + 1;
        while (*p < pcVar5) {
          if (**p == '!') {
            Dau_DsdMergeStoreAddToOutputChar(pS,'!');
            *p = *p + 1;
          }
          pBeg_00 = *p;
          iVar3 = Dau_DsdMergeGetStatus(pBeg_00,pStr,pMatches,pStatus);
          Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar3 != 3));
          if (iVar3 == 3) {
            cVar2 = Dau_DsdMergeStoreCreateDef(pS,pBeg_00,*p + 1);
            Dau_DsdMergeStoreAddToOutputChar(pS,cVar2 + 'a');
          }
          *p = *p + 1;
        }
        Dau_DsdMergeStoreAddToOutputChar(pS,**p);
        if (*p != pcVar5) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x1cb,
                        "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                       );
        }
      }
      else {
        if (iVar3 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x1e9,
                        "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                       );
        }
        Dau_DsdMergeStoreAddToOutputChar(pS,**p);
        iVar3 = Dau_DsdMergeStoreStartDef(pS,**p);
        *p = *p + 1;
        while (*p < pcVar5) {
          q_1 = *p;
          iVar4 = Dau_DsdMergeGetStatus(q_1,pStr,pMatches,pStatus);
          if (**p == '!') {
            if (iVar4 == 3) {
              Dau_DsdMergeStoreAddToDefChar(pS,iVar3,'!');
            }
            else {
              Dau_DsdMergeStoreAddToOutputChar(pS,'!');
            }
            *p = *p + 1;
            q_1 = q_1 + 1;
          }
          Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar4 != 3));
          if (iVar4 == 3) {
            Dau_DsdMergeStoreAddToDef(pS,iVar3,q_1,*p + 1);
          }
          *p = *p + 1;
        }
        Dau_DsdMergeStoreStopDef(pS,iVar3,*pcVar5);
        Dau_DsdMergeStoreAddToOutputChar(pS,(char)iVar3 + 'a');
        Dau_DsdMergeStoreAddToOutputChar(pS,**p);
      }
    }
  }
  else if (fWrite != 0) {
    Dau_DsdMergeStoreAddToOutputChar(pS,**p);
  }
  return;
}

Assistant:

void Dau_DsdMergeSubstitute_rec( Dau_Sto_t * pS, char * pStr, char ** p, int * pMatches, int * pStatus, int fWrite )
{
//    assert( **p != '!' );

    if ( **p == '!' )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }

    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            if ( fWrite )
                for ( ; pTemp < q+1; pTemp++ )
                    Dau_DsdMergeStoreAddToOutputChar( pS, *pTemp );
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        return;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int New, StatusFan, Status = pStatus[*p - pStr];
        char * pBeg, * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( !fWrite )
        {
             assert( Status == 3 );
             *p = q;
             return;
        }
        assert( Status != 3 );
        if ( Status == 0 ) // none pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, 1 );
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 1 || **p == '<' || **p == '{' ) // 1 pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                {
                    int New = Dau_DsdMergeStoreCreateDef( pS, pBeg, *p+1 );
                    Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
                }
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 2 )
        {
            // add more than one defs
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            New = Dau_DsdMergeStoreStartDef( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                if ( **p == '!' )
                {
                    if ( StatusFan != 3 )
                        Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    else
                        Dau_DsdMergeStoreAddToDefChar( pS, New, '!' );
                    (*p)++;
                    pBeg++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                    Dau_DsdMergeStoreAddToDef( pS, New, pBeg, *p+1 );
            }
            Dau_DsdMergeStoreStopDef( pS, New, *q );
            Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            return;
        }
        assert( 0 );
        return;
    }
    assert( 0 );
}